

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall
IMLE<1,_1,_FastLinearExpert>::getForwardSolutions(IMLE<1,_1,_FastLinearExpert> *this)

{
  pointer *ppMVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  int iVar6;
  pointer pMVar7;
  pointer pdVar8;
  pointer pFVar9;
  double *pdVar10;
  ulong uVar11;
  iterator iVar12;
  X *pXVar13;
  ulong uVar14;
  double *pdVar15;
  long lVar16;
  Index col;
  long lVar17;
  ulong uVar18;
  iterator __position;
  long lVar19;
  Index IVar20;
  pointer piVar21;
  long lVar22;
  double dVar23;
  ArrayX sumInvRxj;
  ArrayX sumInvRj;
  plain_array<double,_1,_0,_0> local_90;
  X *local_88;
  long local_80;
  X *local_78;
  IMLE<1,_1,_FastLinearExpert> *local_70;
  long local_68;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_60;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_48;
  
  pXVar13 = &this->zeroX;
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(&local_48,(long)this->nSolFound,pXVar13,(allocator_type *)&local_60);
  local_78 = pXVar13;
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(&local_60,(long)this->nSolFound,pXVar13,(allocator_type *)&local_90);
  pMVar7 = (this->predictions).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->predictions).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar7) {
    (this->predictions).
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar7;
  }
  pMVar7 = (this->predictionsVar).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->predictionsVar).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar7) {
    (this->predictionsVar).
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar7;
  }
  pdVar8 = (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar8) {
    (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar8;
  }
  if (0 < this->M) {
    piVar21 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar15 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    IVar20 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    local_80 = 0;
    lVar19 = 0;
    pXVar13 = (X *)0x0;
    lVar17 = 0xe0;
    do {
      local_68 = lVar17;
      local_88 = pXVar13;
      pFVar9 = (this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               .
               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar23 = pFVar9[lVar19].super_LinearExpert<1,_1>.gamma *
               pFVar9[lVar19].super_LinearExpert<1,_1>.p_z_T +
               (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
               .m_data[piVar21[lVar19]];
      (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data[lVar19] = dVar23;
      if (0 < IVar20) {
        dVar5 = pFVar9[lVar19].super_LinearExpert<1,_1>.p_z_T;
        lVar17 = 0;
        do {
          *(double *)((long)pdVar15 + lVar17 * 8 + IVar20 * (long)local_88) =
               (double)pFVar9[lVar19].super_LinearExpert<1,_1>.invPsi.
                       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage *
               (dVar5 / dVar23);
          lVar17 = lVar17 + 1;
        } while (IVar20 != lVar17);
      }
      pdVar10 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      uVar11 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      uVar14 = uVar11;
      if ((((ulong)(pdVar10 + uVar11 * lVar19) & 7) == 0) &&
         (uVar14 = (ulong)((uint)((ulong)(pdVar10 + uVar11 * lVar19) >> 3) & 1),
         (long)uVar11 <= (long)uVar14)) {
        uVar14 = uVar11;
      }
      if (0 < (long)uVar14) {
        uVar18 = 0;
        do {
          *(double *)((long)pdVar10 + uVar18 * 8 + uVar11 * (long)local_88) =
               pdVar15[IVar20 * lVar19] *
               *(double *)((long)&(pFVar9->super_LinearExpert<1,_1>).Nu + uVar18 * 8 + local_68);
          uVar18 = uVar18 + 1;
        } while (uVar14 != uVar18);
      }
      lVar22 = uVar11 - uVar14;
      lVar17 = (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + uVar14;
      if (1 < lVar22) {
        uVar18 = uVar14;
        do {
          pdVar4 = (double *)
                   ((long)&(pFVar9->super_LinearExpert<1,_1>).pred_x + uVar18 * 8 + local_80);
          dVar23 = pdVar4[1];
          pdVar2 = (double *)((long)pdVar15 + uVar18 * 8 + IVar20 * (long)local_88);
          dVar5 = pdVar2[1];
          pdVar3 = (double *)((long)pdVar10 + uVar18 * 8 + uVar11 * (long)local_88);
          *pdVar3 = *pdVar2 * *pdVar4;
          pdVar3[1] = dVar5 * dVar23;
          uVar18 = uVar18 + 2;
        } while ((long)uVar18 < lVar17);
      }
      if (lVar17 < (long)uVar11) {
        lVar16 = (lVar22 / 2) * 0x10;
        lVar17 = 0;
        do {
          *(double *)((long)pdVar10 + lVar17 * 8 + uVar11 * (long)local_88 + lVar16 + uVar14 * 8) =
               pdVar15[IVar20 * lVar19] *
               *(double *)
                ((long)&(pFVar9->super_LinearExpert<1,_1>).Nu +
                lVar17 * 8 + local_68 + lVar16 + uVar14 * 8);
          lVar17 = lVar17 + 1;
        } while (lVar22 % 2 != lVar17);
      }
      piVar21 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar15 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      IVar20 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      iVar6 = piVar21[lVar19];
      local_48.
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].
      super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
           pdVar15[IVar20 * lVar19] +
           local_48.
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar6].
           super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
      local_60.
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].
      super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
           (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data[(this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows * lVar19] +
           local_60.
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar6].
           super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
      lVar19 = lVar19 + 1;
      local_80 = local_80 + 0x1a8;
      pXVar13 = local_88 + 1;
      lVar17 = local_68 + 0x1a8;
      local_70 = this;
    } while (lVar19 < this->M);
  }
  if (0 < this->nSolFound) {
    local_88 = &this->infinityX;
    lVar17 = 0;
    do {
      dVar23 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[lVar17];
      if ((dVar23 != 0.0) || (NAN(dVar23))) {
        local_90.array[0] =
             (double  [1])
             (local_60.
              super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar17].
              super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0]
             / local_48.
               super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar17].
               super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
               [0]);
        iVar12._M_current =
             (this->predictions).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (this->predictions).
            super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            .
            super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          ::_M_realloc_insert(&(this->predictions).
                               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                              ,iVar12,(value_type *)&local_90);
        }
        else {
          ((iVar12._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
          m_storage.m_data.array[0] = (double)local_90.array[0];
          ppMVar1 = &(this->predictions).
                     super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     .
                     super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        local_90.array[0] =
             (double  [1])
             (1.0 / local_48.
                    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar17].
                    super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
                    array[0]);
        iVar12._M_current =
             (this->predictionsVar).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (this->predictionsVar).
            super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            .
            super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          ::_M_realloc_insert(&(this->predictionsVar).
                               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                              ,iVar12,(value_type *)&local_90);
        }
        else {
          ((iVar12._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
          m_storage.m_data.array[0] = (double)local_90.array[0];
          ppMVar1 = &(this->predictionsVar).
                     super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     .
                     super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        local_90.array[0] =
             (double  [1])
             ((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data[lVar17] / this->sumAll);
        __position._M_current =
             (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *__position._M_current = (double)local_90.array[0];
          goto LAB_0014d552;
        }
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                  (&this->predictionsWeight,__position,local_90.array);
      }
      else {
        iVar12._M_current =
             (this->predictions).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (this->predictions).
            super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            .
            super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          ::_M_realloc_insert(&(this->predictions).
                               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                              ,iVar12,local_78);
        }
        else {
          ((iVar12._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
          m_storage.m_data.array[0] =
               (this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
               m_data.array[0];
          ppMVar1 = &(this->predictions).
                     super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     .
                     super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        iVar12._M_current =
             (this->predictionsVar).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (this->predictionsVar).
            super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            .
            super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          ::_M_realloc_insert(&(this->predictionsVar).
                               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                              ,iVar12,local_88);
        }
        else {
          ((iVar12._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
          m_storage.m_data.array[0] =
               (this->infinityX).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
               m_storage.m_data.array[0];
          ppMVar1 = &(this->predictionsVar).
                     super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     .
                     super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        local_90.array[0] = (double  [1])0.0;
        __position._M_current =
             (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                    (&this->predictionsWeight,__position,local_90.array);
        }
        else {
          *__position._M_current = 0.0;
LAB_0014d552:
          (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < this->nSolFound);
  }
  if (local_60.
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free(local_60.
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free(local_48.
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::getForwardSolutions()
{
    // Aux variables
    ArrayX sumInvRj(nSolFound, zeroX);
    ArrayX sumInvRxj(nSolFound, zeroX);

    // Clear predict data structure
    predictions.clear();
    predictionsVar.clear();
    predictionsWeight.clear();

    for(int j = 0; j < M; j++)
    {
        /* These 3 variables have already been resized in predict() */
        varPhiAuxj(j) = experts[j].getGamma() * experts[j].get_p_z() + sumW[sNearest[j]];
        fInvRj.col(j) = experts[j].getPredXInvVar() * (experts[j].get_p_z() / varPhiAuxj(j));
        invRxj.col(j) = fInvRj.col(j).asDiagonal() * experts[j].getPredX();

        sumInvRj[sNearest[j]] += fInvRj.col(j);
        sumInvRxj[sNearest[j]] += invRxj.col(j);
    }

    // Update storage results
    for( int k = 0; k < nSolFound; k++ )
    {
        if(sum_p_z(k) == 0.0)  // Not likely, but...
        {
            predictions.push_back( zeroX );
            predictionsVar.push_back( infinityX );
            predictionsWeight.push_back( 0.0 );
        }
        else
        {
            predictions.push_back( sumInvRxj[k].cwiseQuotient(sumInvRj[k]) );
            predictionsVar.push_back( sumInvRj[k].cwiseInverse() );
            predictionsWeight.push_back( sum_p_z(k) / sumAll );
        }
    }
}